

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

ly_set * lyd_find_xpath(lyd_node *data,char *expr)

{
  int iVar1;
  LY_ERR *pLVar2;
  lys_module *plVar3;
  ushort local_62;
  lyd_node *plStack_60;
  uint16_t i;
  ly_set *set;
  lyxp_set xp_set;
  char *expr_local;
  lyd_node *data_local;
  
  if ((data == (lyd_node *)0x0) || (expr == (char *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    data_local = (lyd_node *)0x0;
  }
  else {
    memset(&set,0,0x30);
    plVar3 = lyd_node_module(data);
    iVar1 = lyxp_eval(expr,data,LYXP_NODE_ELEM,plVar3,(lyxp_set *)&set,0);
    if (iVar1 == 0) {
      plStack_60 = (lyd_node *)ly_set_new();
      if (plStack_60 == (lyd_node *)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_find_xpath");
        data_local = (lyd_node *)0x0;
      }
      else {
        if ((int)set == 1) {
          for (local_62 = 0; (uint)local_62 < (uint)xp_set.val._8_4_; local_62 = local_62 + 1) {
            if ((*(int *)(xp_set._8_8_ + (ulong)local_62 * 0x10 + 8) == 2) &&
               (iVar1 = ly_set_add((ly_set *)plStack_60,
                                   *(void **)(xp_set._8_8_ + (ulong)local_62 * 0x10),1), iVar1 < 0))
            {
              ly_set_free((ly_set *)plStack_60);
              plStack_60 = (lyd_node *)0x0;
              break;
            }
          }
        }
        lyxp_set_cast((lyxp_set *)&set,LYXP_SET_EMPTY,data,(lys_module *)0x0,0);
        data_local = plStack_60;
      }
    }
    else {
      data_local = (lyd_node *)0x0;
    }
  }
  return (ly_set *)data_local;
}

Assistant:

ly_set *
lyd_find_xpath(const struct lyd_node *data, const char *expr)
{
    struct lyxp_set xp_set;
    struct ly_set *set;
    uint16_t i;

    if (!data || !expr) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    memset(&xp_set, 0, sizeof xp_set);

    if (lyxp_eval(expr, data, LYXP_NODE_ELEM, lyd_node_module(data), &xp_set, 0) != EXIT_SUCCESS) {
        return NULL;
    }

    set = ly_set_new();
    if (!set) {
        LOGMEM;
        return NULL;
    }

    if (xp_set.type == LYXP_SET_NODE_SET) {
        for (i = 0; i < xp_set.used; ++i) {
            if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                if (ly_set_add(set, xp_set.val.nodes[i].node, LY_SET_OPT_USEASLIST) < 0) {
                    ly_set_free(set);
                    set = NULL;
                    break;
                }
            }
        }
    }
    /* free xp_set content */
    lyxp_set_cast(&xp_set, LYXP_SET_EMPTY, data, NULL, 0);

    return set;
}